

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O1

Eso_Man_t * Eso_ManAlloc(Gia_Man_t *pGia)

{
  uint uVar1;
  Eso_Man_t *pEVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  Hsh_VecMan_t *p;
  int *piVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  
  pEVar2 = (Eso_Man_t *)calloc(1,0x40);
  pEVar2->pGia = pGia;
  pVVar7 = pGia->vCis;
  pEVar2->nVars = pVVar7->nSize;
  pEVar2->Cube1 = 1000000000;
  iVar9 = pGia->nObjs;
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar8,0x10);
  }
  pVVar3->pArray = pVVar4;
  pVVar3->nSize = iVar9;
  pEVar2->vEsops = pVVar3;
  p = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar10 = 999;
  while( true ) {
    do {
      uVar12 = uVar10;
      uVar10 = uVar12 + 1;
    } while ((uVar12 & 1) != 0);
    if (uVar10 < 9) break;
    iVar9 = 5;
    while (uVar10 % (iVar9 - 2U) != 0) {
      uVar1 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar10 < uVar1) goto LAB_0073508f;
    }
  }
LAB_0073508f:
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar12) {
    uVar1 = uVar10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar1;
  piVar5 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = uVar10;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,(long)(int)uVar10 << 2);
  }
  p->vTable = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 4000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(16000);
  pVVar4->pArray = piVar5;
  p->vData = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  p->vMap = pVVar4;
  pEVar2->pHash = p;
  uVar10 = pVVar7->nSize;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < uVar10) {
    iVar9 = uVar10 + 1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar6->pArray = pVVar4;
  pVVar6->nSize = uVar10 + 1;
  pEVar2->vCubes = pVVar6;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  if (uVar10 - 1 < 0xf) {
    uVar10 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar10;
  if (uVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar10 << 2);
  }
  pVVar4->pArray = piVar5;
  pEVar2->vCube1 = pVVar4;
  iVar9 = pVVar7->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar4->pArray = piVar5;
  pEVar2->vCube2 = pVVar4;
  iVar9 = pVVar7->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar7->pArray = piVar5;
  pEVar2->vCube = pVVar7;
  pVVar4 = pGia->vCis;
  if (0 < pVVar4->nSize) {
    iVar9 = 0;
    lVar11 = 0;
    do {
      iVar8 = pVVar4->pArray[lVar11];
      if (((long)iVar8 < 0) || (pGia->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar8 == 0) {
        return pEVar2;
      }
      iVar13 = 0;
      do {
        if (pVVar7->nCap < 1) {
          if (pVVar7->pArray == (int *)0x0) {
            piVar5 = (int *)malloc(4);
          }
          else {
            piVar5 = (int *)realloc(pVVar7->pArray,4);
          }
          pVVar7->pArray = piVar5;
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar7->nCap = 1;
        }
        *pVVar7->pArray = iVar9 + iVar13;
        pVVar7->nSize = 1;
        Hsh_VecManAdd(p,pVVar7);
        iVar13 = iVar13 + 1;
      } while (iVar13 == 1);
      if (pVVar3->nSize <= iVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar3->pArray + iVar8,(int)lVar11 * 2);
      lVar11 = lVar11 + 1;
      pVVar4 = pGia->vCis;
      iVar9 = iVar9 + 2;
    } while (lVar11 < pVVar4->nSize);
  }
  return pEVar2;
}

Assistant:

Eso_Man_t * Eso_ManAlloc( Gia_Man_t * pGia )
{
    int i, n, Id;
    Eso_Man_t * p = ABC_CALLOC( Eso_Man_t, 1 );
    p->pGia   = pGia;
    p->nVars  = Gia_ManCiNum(pGia);
    p->Cube1  = ABC_INFINITY;
    p->vEsops = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->pHash  = Hsh_VecManStart( 1000 );
    p->vCubes = Vec_WecStart(Gia_ManCiNum(pGia)+1);
    p->vCube1 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube2 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube  = Vec_IntAlloc(Gia_ManCiNum(pGia));
    Gia_ManForEachCiId( pGia, Id, i )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_IntFill( p->vCube, 1, Abc_Var2Lit(i, n) );
            Hsh_VecManAdd( p->pHash, p->vCube );
        }
        Vec_IntPush( Vec_WecEntry(p->vEsops, Id), Abc_Var2Lit(i, 0) );
    }
    return p;
}